

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

DdNode * GetSingleOutputFunctionRemappedNewDD
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdManager **DdNew)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  DdNode *n;
  DdNode *pDVar5;
  DdManager *ddDestination;
  DdNode *pDVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  DdManager *ddSource;
  ulong uVar10;
  DdNode **ppDVar11;
  
  uVar8 = 0;
  uVar4 = 0;
  if (0 < nOuts) {
    uVar4 = (ulong)(uint)nOuts;
  }
  uVar7 = 0;
  for (; uVar8 != uVar4; uVar8 = uVar8 + 1) {
    n = Cudd_Support(dd,pOutputs[uVar8]);
    Cudd_Ref(n);
    pDVar5 = dd->one;
    uVar10 = 0;
    for (pDVar6 = n; pDVar6 != pDVar5; pDVar6 = (pDVar6->type).kids.T) {
      piVar1 = dd->invperm + uVar10;
      uVar10 = uVar10 + 1;
      GetSingleOutputFunctionRemappedNewDD::Permute[pDVar6->index] = *piVar1;
    }
    pDVar5 = Cudd_bddPermute(dd,pOutputs[uVar8],GetSingleOutputFunctionRemappedNewDD::Permute);
    GetSingleOutputFunctionRemappedNewDD::pRemapped[uVar8] = pDVar5;
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,n);
    uVar2 = uVar10 & 0xffffffff;
    if ((int)uVar10 < (int)uVar7) {
      uVar2 = uVar7;
    }
    uVar7 = uVar2;
  }
  uVar3 = Abc_Base2Log(nOuts);
  uVar10 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  ppDVar11 = GetSingleOutputFunctionRemappedNewDD::pbVarsEnc;
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    pDVar5 = Cudd_bddNewVarAtLevel(dd,(int)uVar10);
    *ppDVar11 = pDVar5;
    ppDVar11 = ppDVar11 + 1;
  }
  pDVar5 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemappedNewDD::pRemapped,nOuts,
                      GetSingleOutputFunctionRemappedNewDD::pbVarsEnc,uVar3);
  Cudd_Ref(pDVar5);
  uVar3 = uVar3 + (int)uVar7;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    GetSingleOutputFunctionRemappedNewDD::Permute[dd->invperm[uVar8]] = (int)uVar8;
  }
  ddDestination = Cudd_Init(uVar3,0,0x100,0x40000,0);
  ddSource = dd;
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  pDVar6 = Cudd_bddTransferPermute
                     (ddSource,ddDestination,pDVar5,GetSingleOutputFunctionRemappedNewDD::Permute);
  Cudd_Ref(pDVar6);
  Cudd_RecursiveDeref(dd,pDVar5);
  for (lVar9 = 0; uVar4 << 3 != lVar9; lVar9 = lVar9 + 8) {
    Cudd_RecursiveDeref(dd,*(DdNode **)
                            ((long)GetSingleOutputFunctionRemappedNewDD::pRemapped + lVar9));
  }
  pDVar5 = Cudd_BddToAdd(ddDestination,pDVar6);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(ddDestination,pDVar6);
  *DdNew = ddDestination;
  Cudd_Deref(pDVar5);
  return pDVar5;
}

Assistant:

DdNode * GetSingleOutputFunctionRemappedNewDD( DdManager * dd, DdNode ** pOutputs, int nOuts, DdManager ** DdNew )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    static DdNode * pbVarsEnc[MAXINPUTS];
    int nVarsEnc;

    DdManager * ddnew;

    DdNode * bSupp, * bTemp;
    int i, v, Counter;
    DdNode * bFunc;

    // these are in the new manager
    DdNode * bFuncNew;
    DdNode * aFuncNew;

    int nVarsMax = 0;

    // perform the remapping and write the DDs into the new manager
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        // to remap the DD into the upper part of the manager
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = dd->invperm[Counter++];

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );


        // determine the largest support size
        if ( nVarsMax < Counter )
            nVarsMax = Counter;
    }
    
    // select the encoding variables to follow immediately after the original variables
    nVarsEnc = Abc_Base2Log(nOuts);
/*
    for ( v = 0; v < nVarsEnc; v++ )
        if ( nVarsMax + v < dd->size )
            pbVarsEnc[v] = dd->var[ dd->invperm[nVarsMax+v] ];
        else
            pbVarsEnc[v] = Cudd_bddNewVar( dd );
*/
    // create the new variables on top of the manager
    for ( v = 0; v < nVarsEnc; v++ )
        pbVarsEnc[v] = Cudd_bddNewVarAtLevel( dd, v );

//fprintf( pTable, "%d ", Cudd_SharingSize( pRemapped, nOuts ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pRemapped, nOuts) );


    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );


    // find the cross-manager permutation
    // the variable from the level v in the old manager 
    // should become a variable number v in the new manager
    for ( v = 0; v < nVarsMax + nVarsEnc; v++ )
        Permute[dd->invperm[v]] = v;


    ///////////////////////////////////////////////////////////////////////////////
    // start the new manager
    ddnew = Cudd_Init( nVarsMax + nVarsEnc, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0);
//  Cudd_AutodynDisable(ddnew);
    Cudd_AutodynEnable(dd, CUDD_REORDER_SYMM_SIFT);

    // transfer it to the new manager
    bFuncNew = Cudd_bddTransferPermute( dd, ddnew, bFunc, Permute );      Cudd_Ref( bFuncNew );
    ///////////////////////////////////////////////////////////////////////////////


    // deref the intermediate results in the old manager
    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );


    ///////////////////////////////////////////////////////////////////////////////
    // convert to ADD in the new manager
    aFuncNew = Cudd_BddToAdd( ddnew, bFuncNew );  Cudd_Ref( aFuncNew );
    Cudd_RecursiveDeref( ddnew, bFuncNew );

    // return the manager
    *DdNew = ddnew;
    ///////////////////////////////////////////////////////////////////////////////

    Cudd_Deref( aFuncNew );
    return aFuncNew;
}